

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_in_out_testing_v2.cpp
# Opt level: O0

void remove_a_file(string *file_name)

{
  int iVar1;
  char *__filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *local_10;
  string *file_name_local;
  
  local_10 = file_name;
  __filename = (char *)std::__cxx11::string::c_str();
  iVar1 = remove(__filename);
  if (iVar1 != 0) {
    std::operator+(&local_50,"\n!! Problems deleting file_name \'",local_10);
    std::operator+(&local_30,&local_50,"\'. Aborting!\n");
    write_colored_text(&local_30,red);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void remove_a_file(const string &file_name) {
    // See also https://www.geeksforgeeks.org/c-program-delete-file/
    if (remove(file_name.c_str()) != 0) {
        write_colored_text("\n!! Problems deleting file_name '" + file_name + "'. Aborting!\n");
        return;
    }
}